

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall tetgenmesh::arraypool::~arraypool(arraypool *this)

{
  char ***pppcVar1;
  long lVar2;
  
  pppcVar1 = &this->toparray;
  if (this->toparray != (char **)0x0) {
    if (0 < this->toparraylen) {
      lVar2 = 0;
      do {
        if ((*pppcVar1)[lVar2] != (char *)0x0) {
          free((*pppcVar1)[lVar2]);
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < this->toparraylen);
    }
    free(*pppcVar1);
  }
  this->toparraylen = 0;
  *pppcVar1 = (char **)0x0;
  this->objects = 0;
  this->totalmemory = 0;
  return;
}

Assistant:

tetgenmesh::arraypool::~arraypool()
{
  int i;

  // Has anything been allocated at all?
  if (toparray != (char **) NULL) {
    // Walk through the top array.
    for (i = 0; i < toparraylen; i++) {
      // Check every pointer; NULLs may be scattered randomly.
      if (toparray[i] != (char *) NULL) {
        // Free an allocated block.
        free((void *) toparray[i]);
      }
    }
    // Free the top array.
    free((void *) toparray);
  }

  // The top array is no longer allocated.
  toparray = (char **) NULL;
  toparraylen = 0;
  objects = 0;
  totalmemory = 0;
}